

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_example.cc
# Opt level: O2

void DumpExtensions(ExtensionMap *extension,int indent)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  undefined4 in_register_00000034;
  allocator local_79;
  undefined8 local_78;
  string local_70;
  string local_50;
  
  local_78 = CONCAT44(in_register_00000034,indent);
  for (p_Var2 = (extension->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(extension->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    Indent_abi_cxx11_(&local_70,(int)local_78);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_50,"extensions",&local_79);
    PrintValue(&local_70,&local_50,(Value *)(p_Var2 + 2),indent + 1,true);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

static void DumpExtensions(const tinygltf::ExtensionMap &extension,
                           const int indent) {
  // TODO(syoyo): pritty print Value
  for (auto &e : extension) {
    std::cout << Indent(indent) << e.first << std::endl;
    std::cout << PrintValue("extensions", e.second, indent + 1) << std::endl;
  }
}